

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_test.cpp
# Opt level: O3

void jsonnet::internal::anon_unknown_0::testEncodeDecode(char32_t codepoint,string *expect_utf8)

{
  ulong uVar1;
  uint uVar2;
  char32_t cVar3;
  pointer *__ptr;
  char *pcVar4;
  size_t at;
  char32_t decoded;
  string buffer;
  size_t len;
  AssertHelper local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  AssertHelper local_48;
  char32_t local_40;
  char32_t local_3c;
  string local_38;
  ulong local_18;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_40 = codepoint;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  uVar2 = encode_utf8(codepoint,&local_38);
  local_18 = (ulong)uVar2;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       expect_utf8->_M_string_length;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_58,"len","expect_utf8.size()",&local_18,(unsigned_long *)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/unicode_test.cpp"
               ,0x1e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_58,"buffer","expect_utf8",&local_38,expect_utf8);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/unicode_test.cpp"
               ,0x1f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcVar4 = (expect_utf8->_M_dataplus)._M_p;
  cVar3 = (char32_t)*pcVar4;
  local_3c = cVar3;
  if (*pcVar4 < '\0') {
    uVar1 = expect_utf8->_M_string_length;
    if ((cVar3 & 0xe0U) == 0xc0) {
      local_3c = L'�';
      if (1 < uVar1) {
        local_60._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        local_3c = L'�';
        if (((byte)pcVar4[1] & 0xffffffc0) == 0x80) {
          local_3c = (byte)pcVar4[1] & 0x3f | (cVar3 & 0x1fU) << 6;
        }
      }
    }
    else if ((cVar3 & 0xf0U) == 0xe0) {
      local_3c = L'�';
      if (2 < uVar1) {
        local_60._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        if (((int)pcVar4[1] & 0xc0U) == 0x80) {
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
          if (((byte)pcVar4[2] & 0xffffffc0) == 0x80) {
            local_3c = (byte)pcVar4[2] & 0x3f |
                       ((int)pcVar4[1] & 0x3fU) << 6 | (cVar3 & 0xfU) << 0xc;
          }
        }
      }
    }
    else {
      local_3c = L'�';
      if (3 < uVar1 && (cVar3 & 0xf8U) == 0xf0) {
        local_60._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        if (((int)pcVar4[1] & 0xc0U) == 0x80) {
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
          if (((int)pcVar4[2] & 0xc0U) == 0x80) {
            local_60._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
            if (((byte)pcVar4[3] & 0xffffffc0) == 0x80) {
              local_3c = (byte)pcVar4[3] & 0x3f |
                         ((int)pcVar4[2] & 0x3fU) << 6 |
                         ((int)pcVar4[1] & 0x3fU) << 0xc | (cVar3 & 7U) << 0x12;
            }
          }
        }
      }
    }
  }
  testing::internal::CmpHelperEQ<char32_t,char32_t>
            (local_58,"decoded","codepoint",&local_3c,&local_40);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/unicode_test.cpp"
               ,0x23,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  local_68.data_ = (AssertHelperData *)(expect_utf8->_M_string_length - 1);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_58,"at","expect_utf8.size() - 1",(unsigned_long *)&local_60,
             (unsigned_long *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/unicode_test.cpp"
               ,0x24,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void testEncodeDecode(char32_t codepoint, const std::string &expect_utf8) {
    std::string buffer;
    size_t len = encode_utf8(codepoint, buffer);
    EXPECT_EQ(len, expect_utf8.size());
    EXPECT_EQ(buffer, expect_utf8);

    size_t at = 0;
    char32_t decoded = decode_utf8(expect_utf8, at);
    EXPECT_EQ(decoded, codepoint);
    EXPECT_EQ(at, expect_utf8.size() - 1);
}